

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GridAxisRegular::operator==(GridAxisRegular *this,GridAxisRegular *Value)

{
  if ((((((double)this->m_f64DomainInitialXi == (double)Value->m_f64DomainInitialXi) &&
        (!NAN((double)this->m_f64DomainInitialXi) && !NAN((double)Value->m_f64DomainInitialXi))) &&
       ((double)this->m_f64DomainFinalXi == (double)Value->m_f64DomainFinalXi)) &&
      ((!NAN((double)this->m_f64DomainFinalXi) && !NAN((double)Value->m_f64DomainFinalXi) &&
       (this->m_ui16DomainPointsXi == Value->m_ui16DomainPointsXi)))) &&
     ((this->m_ui8InterleafFactor == Value->m_ui8InterleafFactor &&
      ((this->m_ui8AxisType == Value->m_ui8AxisType &&
       (this->m_ui16NumPoints == Value->m_ui16NumPoints)))))) {
    return this->m_ui16InitialIndex == Value->m_ui16InitialIndex;
  }
  return false;
}

Assistant:

KBOOL GridAxisRegular::operator == ( const GridAxisRegular & Value ) const
{
    if( m_f64DomainInitialXi != Value.m_f64DomainInitialXi ) return false;
    if( m_f64DomainFinalXi   != Value.m_f64DomainFinalXi )   return false;
    if( m_ui16DomainPointsXi != Value.m_ui16DomainPointsXi ) return false;
    if( m_ui8InterleafFactor != Value.m_ui8InterleafFactor ) return false;
    if( m_ui8AxisType        != Value.m_ui8AxisType )        return false;
    if( m_ui16NumPoints      != Value.m_ui16NumPoints )      return false;
    if( m_ui16InitialIndex   != Value.m_ui16InitialIndex )   return false;
    return true;
}